

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float rounding,int rounding_corners_flags)

{
  int rounding_corners_flags_local;
  float rounding_local;
  ImU32 col_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    if (rounding <= 0.0) {
      PrimReserve(this,6,4);
      PrimRect(this,a,b,col);
    }
    else {
      PathRect(this,a,b,rounding,rounding_corners_flags);
      PathFillConvex(this,col);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& a, const ImVec2& b, ImU32 col, float rounding, int rounding_corners_flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding > 0.0f)
    {
        PathRect(a, b, rounding, rounding_corners_flags);
        PathFillConvex(col);
    }
    else
    {
        PrimReserve(6, 4);
        PrimRect(a, b, col);
    }
}